

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_IAB.cpp
# Opt level: O2

bool anon_unknown.dwarf_10dc1f::checkFrameCapacity
               (FrameBuffer *frame,size_t size,bool reallocate_if_needed)

{
  bool bVar1;
  Result_t result;
  int local_78 [26];
  
  bVar1 = size <= *(uint *)(frame + 0x10);
  if (reallocate_if_needed && !bVar1) {
    ASDCP::FrameBuffer::Capacity((uint)local_78);
    bVar1 = local_78[0] == Kumu::RESULT_OK;
    Kumu::Result_t::~Result_t((Result_t *)local_78);
  }
  return bVar1;
}

Assistant:

bool checkFrameCapacity(ASDCP::FrameBuffer& frame, size_t size, bool reallocate_if_needed) {

    if (frame.Capacity() < size) {
      if (!reallocate_if_needed) {
        return false;
      }
      Result_t result = frame.Capacity(size);
      return result == RESULT_OK;
    }
    return true;
  }